

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Common.cpp
# Opt level: O1

error<idx2::idx2_err_code> idx2::Finalize(idx2_file *Idx2,params *P)

{
  array<idx2::subband> *Subbands;
  array<idx2::v3<int>_> *Array;
  byte *pbVar1;
  v3<int> *pvVar2;
  int iVar3;
  byte *pbVar4;
  undefined1 auVar5 [16];
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  int iVar11;
  u8 uVar12;
  byte bVar13;
  int D_2;
  int iVar14;
  int iVar15;
  name_map *pnVar16;
  size_t sVar17;
  u64 uVar18;
  idx2 *this;
  char *pcVar19;
  idx2_err_code iVar20;
  byte bVar21;
  uint uVar22;
  long lVar24;
  ulong uVar25;
  uint uVar23;
  int D;
  long lVar26;
  int iVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  params *P_00;
  uint uVar31;
  byte bVar32;
  int iVar33;
  int *piVar34;
  str pcVar35;
  ulong uVar36;
  long lVar37;
  int D_1;
  uint uVar38;
  size_t unaff_R13;
  undefined3 uVar39;
  anon_union_8_2_2df48d06_for_stref_0 aVar40;
  undefined4 uVar41;
  ulong uVar42;
  v3<int> *pvVar43;
  long *in_FS_OFFSET;
  bool bVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  error<idx2::idx2_err_code> eVar48;
  v3i N3;
  v3i N3_00;
  v3i N3_01;
  char TformOrder [8];
  v3i F3;
  char BrickOrder [128];
  undefined8 local_1f0;
  array<idx2::stack_string<128>_> *local_1e8;
  stack_array<idx2::v3<int>,_16> *local_1e0;
  stack_array<idx2::v3<int>,_16> *local_1d8;
  stack_array<idx2::v3<int>,_16> *local_1d0;
  anon_union_8_2_2df48d06_for_stref_0 local_1c8;
  uint local_1c0;
  anon_union_8_2_2df48d06_for_stref_0 local_1b8;
  undefined8 uStack_1b0;
  undefined8 *puStack_1a8;
  long lStack_1a0;
  undefined8 uStack_198;
  long *plStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  byte local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  byte local_128;
  anon_union_8_2_2df48d06_for_stref_0 local_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  byte local_d8;
  anon_union_8_2_2df48d06_for_stref_0 local_c8;
  undefined8 uStack_c0;
  undefined8 *puStack_b8;
  long lStack_b0;
  undefined8 uStack_a8;
  long *plStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  byte local_88;
  array<idx2::stack_string<128>_> *local_40;
  array<idx2::stack_string<128>_> *local_38;
  
  iVar15 = (Idx2->BrickDims3).field_0.field_0.X;
  if (((POPCOUNT(iVar15) == 1) &&
      (iVar33 = (Idx2->BrickDims3).field_0.field_0.Y, POPCOUNT(iVar33) == 1)) &&
     (iVar27 = (Idx2->BrickDims3).field_0.field_0.Z, POPCOUNT(iVar27) == 1)) {
    if ((((Idx2->Dims3).field_0.field_0.X < iVar15) || ((Idx2->Dims3).field_0.field_0.Y < iVar33))
       || ((Idx2->Dims3).field_0.field_0.Z < iVar27)) {
      *(char **)(*in_FS_OFFSET + -0xe80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x170;
      pnVar16 = &idx2_err_code_s::NameMap;
      iVar20 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != BrickSizeTooBig) {
        lVar30 = 0x28;
        do {
          if (lVar30 == 0x3b8) {
            iVar20 = __Invalid__;
            goto LAB_00167d78;
          }
          pcVar19 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar30);
          lVar30 = lVar30 + 0x18;
        } while (*pcVar19 != '\x16');
        iVar20 = BrickSizeTooBig;
      }
LAB_00167d78:
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar20) {
        lVar30 = 0;
        do {
          lVar24 = lVar30;
          if (lVar24 == 0x390) goto LAB_0016874e;
          lVar30 = lVar24 + 0x18;
        } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar24] != iVar20);
        pnVar16 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar24);
      }
      lVar30 = *in_FS_OFFSET;
      iVar15 = snprintf((char *)(lVar30 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                        (ulong)(uint)pnVar16->Arr[0].Name.Size,pnVar16->Arr[0].Name.field_0.Ptr,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                        ,0x170);
      unaff_R13 = 0x400 - (long)iVar15;
      pcVar19 = " total dims: (%d %d %d), brick dims: (%d %d %d)\n";
      snprintf((char *)(lVar30 + -0xc80) + iVar15,unaff_R13,
               " total dims: (%d %d %d), brick dims: (%d %d %d)\n",
               (ulong)(uint)(Idx2->Dims3).field_0.field_0.X,
               (ulong)(uint)(Idx2->Dims3).field_0.field_0.Y,
               (ulong)(uint)(Idx2->Dims3).field_0.field_0.Z,(Idx2->BrickDims3).field_0.field_0.X,
               (Idx2->BrickDims3).field_0.field_0.Y,(Idx2->BrickDims3).field_0.field_0.Z);
      uVar38 = 0x10016;
    }
    else {
      *(char **)(*in_FS_OFFSET + -0xe80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x171;
      pcVar19 = "";
      uVar38 = 0;
    }
  }
  else {
    *(char **)(*in_FS_OFFSET + -0xe80) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
    ;
    *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x16b;
    pnVar16 = &idx2_err_code_s::NameMap;
    iVar20 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != BrickSizeNotPowerOfTwo) {
      lVar30 = 0x28;
      do {
        if (lVar30 == 0x3b8) {
          iVar20 = __Invalid__;
          goto LAB_00166fc2;
        }
        pcVar19 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar30);
        lVar30 = lVar30 + 0x18;
      } while (*pcVar19 != '\x15');
      iVar20 = BrickSizeNotPowerOfTwo;
    }
LAB_00166fc2:
    if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar20) {
      lVar30 = 0;
      do {
        lVar24 = lVar30;
        if (lVar24 == 0x390) goto LAB_0016874e;
        lVar30 = lVar24 + 0x18;
      } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar24] != iVar20);
      pnVar16 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar24);
    }
    lVar30 = *in_FS_OFFSET;
    iVar15 = snprintf((char *)(lVar30 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                      (ulong)(uint)pnVar16->Arr[0].Name.Size,pnVar16->Arr[0].Name.field_0.Ptr,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                      ,0x16b);
    unaff_R13 = 0x400 - (long)iVar15;
    pcVar19 = "(%d %d %d)\n";
    snprintf((char *)(lVar30 + -0xc80) + iVar15,unaff_R13,"(%d %d %d)\n",
             (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.X,
             (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Y,
             (ulong)(uint)(Idx2->BrickDims3).field_0.field_0.Z);
    uVar38 = 0x10015;
  }
  if ((char)uVar38 != '\0') {
    unaff_R13 = (size_t)(uVar38 | 0x100);
    *(undefined4 *)(*in_FS_OFFSET + -0xf7c) = 0x2d8;
    *(char **)(*in_FS_OFFSET + -0xe78) =
         "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
    ;
  }
  auVar5._8_8_ = unaff_R13;
  auVar5._0_8_ = pcVar19;
  auVar8 = auVar5._0_12_;
  if ((char)uVar38 == '\0') {
    auVar45._8_8_ = 0;
    auVar45._0_8_ = P->Tolerance;
    auVar46._8_8_ = 0x7fffffffffffffff;
    auVar46._0_8_ = 0x7fffffffffffffff;
    auVar5 = vandpd_avx(auVar45,auVar46);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = Idx2->Tolerance;
    auVar5 = vmaxsd_avx(auVar47,auVar5);
    P->Tolerance = auVar5._0_8_;
    if (Idx2->NLevels == '\0') {
      iVar15 = (Idx2->Dims3).field_0.field_0.X;
      iVar33 = (Idx2->BrickDims3).field_0.field_0.X;
      if (iVar33 <= iVar15) {
        iVar27 = (Idx2->BrickDims3).field_0.field_0.Z;
        iVar14 = (Idx2->Dims3).field_0.field_0.Y;
        iVar28 = (Idx2->BrickDims3).field_0.field_0.Y;
        do {
          if ((iVar14 < iVar28) || (iVar3 = (Idx2->Dims3).field_0.field_0.Z, iVar3 < iVar27)) break;
          iVar11 = iVar33 * 2;
          if (iVar33 == 1) {
            iVar11 = iVar33;
          }
          iVar33 = iVar11;
          iVar11 = iVar28 * 2;
          if (iVar28 == 1) {
            iVar11 = iVar28;
          }
          iVar28 = iVar11;
          iVar11 = iVar27 * 2;
          if (iVar27 == 1) {
            iVar11 = iVar27;
          }
          iVar27 = iVar11;
          if (((iVar33 <= iVar15) && (iVar28 <= iVar14)) && (iVar27 <= iVar3)) {
            Idx2->NLevels = Idx2->NLevels + '\x01';
          }
        } while (iVar33 <= iVar15);
      }
    }
    if (Idx2->NLevels < '\x11') {
      if ((Idx2->BitPlanesPerFile < Idx2->BitPlanesPerChunk) ||
         (Idx2->BitPlanesPerFile % Idx2->BitPlanesPerChunk != 0)) {
        *(char **)(*in_FS_OFFSET + -0xe80) =
             "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
        ;
        *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x2e0;
        pnVar16 = &idx2_err_code_s::NameMap;
        iVar20 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
        if (idx2_err_code_s::NameMap.Arr[0].ItemVal != SizeMismatched) {
          lVar30 = 0x28;
          do {
            if (lVar30 == 0x3b8) {
              iVar20 = __Invalid__;
              goto LAB_00167325;
            }
            pcVar19 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar30);
            lVar30 = lVar30 + 0x18;
          } while (*pcVar19 != '\x04');
          iVar20 = SizeMismatched;
        }
LAB_00167325:
        if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar20) {
          lVar30 = 0;
          do {
            lVar24 = lVar30;
            if (lVar24 == 0x390) {
LAB_0016874e:
              __assert_fail("It != End(EnumS.NameMap)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.h"
                            ,0x38,"stref idx2::ToString(idx2_err_code)");
            }
            lVar30 = lVar24 + 0x18;
          } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar24] != iVar20);
          pnVar16 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar24);
        }
        lVar30 = *in_FS_OFFSET;
        iVar15 = snprintf((char *)(lVar30 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                          (ulong)(uint)pnVar16->Arr[0].Name.Size,pnVar16->Arr[0].Name.field_0.Ptr,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                          ,0x2e0);
        snprintf((char *)(lVar30 + -0xc80) + iVar15,0x400 - (long)iVar15,
                 "BitPlanesPerFile not multiple of BitPlanesPerChunk\n");
        auVar9._8_8_ = 0x10004;
        auVar9._0_8_ = "BitPlanesPerFile not multiple of BitPlanesPerChunk\n";
        auVar8 = auVar9._0_12_;
      }
      else {
        local_1f0 = 0;
        iVar15 = 0;
        lVar30 = 0x27;
        do {
          if (1 < *(int *)(Idx2->Name + lVar30 * 4)) {
            lVar24 = (long)iVar15;
            iVar15 = iVar15 + 1;
            *(char *)((long)&local_1f0 + lVar24) = (char)lVar30 + '1';
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 != 0x2a);
        *(undefined2 *)((long)&local_1f0 + (long)iVar15) = 0x2b2b;
        local_c8.Ptr = (str)&local_1f0;
        sVar17 = strlen(local_c8.Ptr);
        uStack_c0 = CONCAT44(uStack_c0._4_4_,(int)sVar17);
        uVar18 = EncodeTransformOrder((stref *)&local_c8);
        Idx2->TransformOrder = uVar18;
        uVar12 = DecodeTransformOrder(uVar18,1,(Idx2->TransformOrderFull).Data);
        (Idx2->TransformOrderFull).Len = uVar12;
        iVar15 = (Idx2->BrickDims3).field_0.field_0.X;
        iVar33 = (Idx2->BrickDims3).field_0.field_0.Y;
        iVar27 = (Idx2->BrickDims3).field_0.field_0.Z;
        (Idx2->BrickDimsExt3).field_0.field_0.X = (uint)(1 < iVar15) + iVar15;
        (Idx2->BrickDimsExt3).field_0.field_0.Y = (uint)(1 < iVar33) + iVar33;
        (Idx2->BrickDimsExt3).field_0.field_0.Z = (uint)(1 < iVar27) + iVar27;
        Subbands = &Idx2->Subbands;
        BuildSubbands(&Idx2->BrickDimsExt3,1,Idx2->TransformOrder,Subbands);
        BuildSubbands(&Idx2->BrickDims3,1,Idx2->TransformOrder,&Idx2->SubbandsNonExt);
        local_168 = (1L << (*(byte *)((long)&(P->DownsamplingFactor3).field_0 + 4) & 0x3f)) << 0x20
                    | 1L << ((ulong)*(byte *)&(P->DownsamplingFactor3).field_0 & 0x3f);
        uStack_160 = CONCAT44(uStack_160._4_4_,
                              1 << (*(byte *)((long)&(P->DownsamplingFactor3).field_0 + 8) & 0x1f));
        if (Mallocator()::Instance == '\0') {
          Finalize();
        }
        if (Mallocator()::Instance == '\0') {
          Finalize();
        }
        local_c8.Ptr = (str)0x0;
        uStack_c0 = 0;
        puStack_b8 = &Mallocator()::Instance;
        lStack_b0 = 0;
        uStack_a8 = 0;
        plStack_a0 = &Mallocator()::Instance;
        if (Mallocator()::Instance == '\0') {
          Finalize();
        }
        if (Mallocator()::Instance == '\0') {
          Finalize();
        }
        local_1b8.Ptr = (str)0x0;
        uStack_1b0 = 0;
        puStack_1a8 = &Mallocator()::Instance;
        lStack_1a0 = 0;
        uStack_198 = 0;
        plStack_190 = &Mallocator()::Instance;
        Resize<idx2::array<idx2::v3<int>>>
                  ((array<idx2::array<idx2::v3<int>_>_> *)&local_c8,(long)Idx2->NLevels);
        Resize<idx2::array<idx2::v3<int>>>
                  ((array<idx2::array<idx2::v3<int>_>_> *)&local_1b8,(long)Idx2->NLevels);
        if (Idx2->NLevels != '\0') {
          uVar42 = 0;
          do {
            lVar30 = uVar42 * 0x30;
            Resize<idx2::v3<int>>
                      ((array<idx2::v3<int>_> *)(local_1b8.Ptr + lVar30),(Idx2->Subbands).Size);
            Resize<idx2::v3<int>>
                      ((array<idx2::v3<int>_> *)(local_c8.Ptr + lVar30),(Idx2->Subbands).Size);
            if (uVar42 == 0x10) {
              pcVar19 = 
              "t &idx2::stack_array<idx2::array<idx2::v3<int>>, 16>::operator[](int) const [t = idx2::array<idx2::v3<int>>, N = 16]"
              ;
              goto LAB_001687f4;
            }
            Array = (Idx2->DecodeSubbandSpacings).Arr + uVar42;
            Resize<idx2::v3<int>>(Array,(Idx2->Subbands).Size);
            if (*(long *)(local_1b8.Ptr + lVar30 + 0x18) == 0) {
              bVar32 = 0xff;
            }
            else {
              bVar32 = 0xff;
              lVar24 = uVar42 * 0x30;
              lVar37 = 0;
              lVar30 = 0;
              do {
                iVar14 = 1;
                iVar27 = 1;
                iVar33 = 1;
                iVar15 = 1;
                if (uVar42 != 0) {
                  piVar34 = *(int **)(local_1b8.Ptr + lVar24 + -0x30);
                  iVar15 = *piVar34;
                  iVar33 = piVar34[1];
                  iVar27 = piVar34[2];
                }
                lVar26 = *(long *)((Subbands->Buffer).Data + lVar30 * 0x40);
                iVar27 = (int)(lVar26 * 2 >> 0x2b) * iVar27;
                local_118._4_4_ = (int)((lVar26 << 0x16) >> 0x2b) * iVar33;
                local_118._0_4_ = (int)((lVar26 << 0x2b) >> 0x2b) * iVar15;
                lVar26 = *(long *)(local_c8.Ptr + lVar24);
                *(anon_union_8_2_2df48d06_for_stref_0 *)(lVar26 + lVar30 * 0xc) = local_118;
                *(int *)(lVar26 + 8 + lVar30 * 0xc) = iVar27;
                uStack_110 = CONCAT44(uStack_110._4_4_,iVar27);
                iVar33 = 1;
                iVar15 = 1;
                if (uVar42 != 0) {
                  piVar34 = *(int **)(local_1b8.Ptr + lVar24 + -0x30);
                  iVar15 = *piVar34;
                  iVar33 = piVar34[1];
                  iVar14 = piVar34[2];
                }
                lVar26 = *(long *)((Subbands->Buffer).Data + lVar30 * 0x40 + 0x10);
                local_1c0 = (int)(lVar26 * 2 >> 0x2b) * iVar14;
                local_1c8._4_4_ = (int)((lVar26 << 0x16) >> 0x2b) * iVar33;
                local_1c8._0_4_ = (int)((lVar26 << 0x2b) >> 0x2b) * iVar15;
                lVar26 = *(long *)(local_1b8.Ptr + lVar24);
                lVar6 = lVar30 * 0xc;
                *(anon_union_8_2_2df48d06_for_stref_0 *)(lVar26 + lVar6) = local_1c8;
                *(uint *)(lVar26 + 8 + lVar6) = local_1c0;
                pbVar4 = (Array->Buffer).Data;
                pbVar1 = pbVar4 + lVar6;
                pbVar1[0] = '\x01';
                pbVar1[1] = '\0';
                pbVar1[2] = '\0';
                pbVar1[3] = '\0';
                pbVar1[4] = '\x01';
                pbVar1[5] = '\0';
                pbVar1[6] = '\0';
                pbVar1[7] = '\0';
                pbVar4 = pbVar4 + lVar6 + 8;
                pbVar4[0] = '\x01';
                pbVar4[1] = '\0';
                pbVar4[2] = '\0';
                pbVar4[3] = '\0';
                lVar26 = 0;
                do {
                  iVar15 = *(int *)((long)&local_168 + lVar26 * 4);
                  if (*(int *)((long)&local_118 + lVar26 * 4) % iVar15 == 0) {
                    iVar33 = *(int *)((long)&local_1c8 + lVar26 * 4);
                    if (iVar33 % iVar15 != 0) {
                      *(int *)((Array->Buffer).Data + lVar26 * 4 + lVar37) = iVar15 / iVar33;
                    }
                  }
                  else {
                    bVar32 = bVar32 & ~(byte)(1L << ((byte)lVar30 & 0x3f));
                  }
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 3);
                lVar30 = lVar30 + 1;
                lVar37 = lVar37 + 0xc;
              } while (*(long *)(local_1b8.Ptr + lVar24 + 0x18) != lVar30);
            }
            uVar36 = uVar42 + 1;
            bVar21 = bVar32;
            if (bVar32 == 1) {
              bVar21 = 0;
            }
            if ((long)Idx2->NLevels <= (long)uVar36) {
              bVar21 = bVar32;
            }
            (Idx2->DecodeSubbandMasks).Arr[uVar42] = bVar21;
            uVar42 = uVar36;
          } while (uVar36 != (uint)(int)Idx2->NLevels);
        }
        aVar40 = local_1b8;
        if (lStack_1a0 != 0) {
          do {
            (**(code **)(*(long *)((anon_union_8_2_2df48d06_for_stref_0 *)(aVar40.Ptr + 0x28))->Ptr
                        + 8))(((anon_union_8_2_2df48d06_for_stref_0 *)(aVar40.Ptr + 0x28))->Ptr,
                              aVar40.Ptr);
            ((anon_union_8_2_2df48d06_for_stref_0 *)(aVar40.Ptr + 0x18))->Ptr = (str)0x0;
            ((anon_union_8_2_2df48d06_for_stref_0 *)(aVar40.Ptr + 0x20))->Ptr = (str)0x0;
            aVar40.Ptr = aVar40.Ptr + 0x30;
          } while ((anon_union_8_2_2df48d06_for_stref_0 *)aVar40.Ptr !=
                   (anon_union_8_2_2df48d06_for_stref_0 *)(local_1b8.Ptr + lStack_1a0 * 0x30));
        }
        (**(code **)(*plStack_190 + 8))();
        lStack_1a0 = 0;
        uStack_198 = 0;
        aVar40 = local_c8;
        if (lStack_b0 != 0) {
          do {
            (**(code **)(**(long **)(aVar40.Ptr + 0x28) + 8))
                      (*(long **)(aVar40.Ptr + 0x28),aVar40.Ptr);
            *(char *)((long)aVar40 + 0x18) = '\0';
            *(char *)((long)aVar40 + 0x19) = '\0';
            *(char *)((long)aVar40 + 0x1a) = '\0';
            *(char *)((long)aVar40 + 0x1b) = '\0';
            *(char *)((long)aVar40 + 0x1c) = '\0';
            *(char *)((long)aVar40 + 0x1d) = '\0';
            *(char *)((long)aVar40 + 0x1e) = '\0';
            *(char *)((long)aVar40 + 0x1f) = '\0';
            *(char *)((long)aVar40 + 0x20) = '\0';
            *(char *)((long)aVar40 + 0x21) = '\0';
            *(char *)((long)aVar40 + 0x22) = '\0';
            *(char *)((long)aVar40 + 0x23) = '\0';
            *(char *)((long)aVar40 + 0x24) = '\0';
            *(char *)((long)aVar40 + 0x25) = '\0';
            *(char *)((long)aVar40 + 0x26) = '\0';
            *(char *)((long)aVar40 + 0x27) = '\0';
            aVar40.Ptr = aVar40.Ptr + 0x30;
          } while (aVar40.Ptr != local_c8.Ptr + lStack_b0 * 0x30);
        }
        (**(code **)(*plStack_a0 + 8))();
        lStack_b0 = 0;
        uStack_a8 = 0;
        lVar30 = *(long *)((Idx2->SubbandsNonExt).Buffer.Data + 8);
        iVar15 = (Idx2->BrickDims3).field_0.field_0.X;
        iVar33 = (Idx2->BrickDims3).field_0.field_0.Y;
        iVar27 = (Idx2->BrickDims3).field_0.field_0.Z;
        (Idx2->GroupBrick3).field_0.field_3.XY.field_0 =
             (anon_union_8_4_6ba14846_for_v2<int>_1)
             ((long)iVar33 / (long)(int)((lVar30 << 0x16) >> 0x2b) << 0x20 |
             (long)iVar15 / (long)(((int)lVar30 << 0xb) >> 0xb) & 0xffffffffU);
        (Idx2->GroupBrick3).field_0.field_0.Z = iVar27 / (int)(lVar30 * 2 >> 0x2b);
        if (Idx2->NLevels != '\0') {
          lVar24 = (long)((Idx2->Dims3).field_0.field_0.Z + iVar27 + -1) / (long)iVar27;
          lVar30 = (long)((Idx2->Dims3).field_0.field_0.Y + iVar33 + -1) / (long)iVar33;
          uVar42 = (long)(iVar15 + (Idx2->Dims3).field_0.field_0.X + -1) / (long)iVar15;
          piVar34 = &(Idx2->NBricks3).Arr[0].field_0.field_0.Z;
          uVar36 = 0;
          do {
            if (uVar36 == 0x10) goto LAB_001687a6;
            uVar25 = uVar42 & 0xffffffff | lVar30 << 0x20;
            ((anon_struct_12_3_4e9264bd_for_anon_union_12_8_3dedac88_for_v3<int>_1_0 *)
            (piVar34 + -2))->X = (int)uVar25;
            ((anon_struct_12_3_4e9264bd_for_anon_union_12_8_3dedac88_for_v3<int>_1_0 *)
            (piVar34 + -2))->Y = (int)(uVar25 >> 0x20);
            *piVar34 = (int)lVar24;
            iVar15 = (Idx2->GroupBrick3).field_0.field_0.X;
            iVar33 = (Idx2->GroupBrick3).field_0.field_0.Y;
            iVar27 = (Idx2->GroupBrick3).field_0.field_0.Z;
            uVar42 = (long)((int)uVar42 + -1 + iVar15) / (long)iVar15;
            lVar30 = (long)((int)lVar30 + iVar33 + -1) / (long)iVar33;
            lVar24 = (long)((int)lVar24 + iVar27 + -1) / (long)iVar27;
            uVar36 = uVar36 + 1;
            piVar34 = piVar34 + 3;
          } while (uVar36 != (uint)(int)Idx2->NLevels);
        }
        local_38 = &Idx2->BricksOrderStr;
        P_00 = (params *)(long)Idx2->NLevels;
        Resize<idx2::stack_string<128>>(local_38,(i64)P_00);
        bVar44 = Idx2->NLevels == '\0';
        if (!bVar44) {
          local_1d8 = &Idx2->NBricks3;
          local_1e0 = (stack_array<idx2::v3<int>,_16> *)(*in_FS_OFFSET + -0xe80);
          local_1e8 = (array<idx2::stack_string<128>_> *)(*in_FS_OFFSET + -0xf80);
          uVar42 = 0;
          bVar44 = false;
          do {
            if (uVar42 == 0x10) goto LAB_001687a6;
            P_00 = *(params **)&local_1d8->Arr[uVar42].field_0;
            uVar36 = (ulong)(int)P_00;
            lVar30 = 0x3f;
            if (uVar36 != 0) {
              for (; uVar36 >> lVar30 == 0; lVar30 = lVar30 + -1) {
              }
            }
            lVar24 = 0;
            bVar32 = -(((ulong)P_00 & 0xffffffff) == 0) | (byte)lVar30;
            uVar25 = (long)P_00 >> 0x20;
            lVar30 = 0x3f;
            if (uVar25 != 0) {
              for (; uVar25 >> lVar30 == 0; lVar30 = lVar30 + -1) {
              }
            }
            bVar21 = -((ulong)P_00 >> 0x20 == 0) | (byte)lVar30;
            local_1d0 = (stack_array<idx2::v3<int>,_16> *)
                        (long)local_1d8->Arr[uVar42].field_0.field_0.Z;
            uVar38 = (uint)(char)((1L << (bVar32 & 0x3f) != uVar36) + bVar32);
            lVar30 = 0x3f;
            if (local_1d0 != (stack_array<idx2::v3<int>,_16> *)0x0) {
              for (; (ulong)local_1d0 >> lVar30 == 0; lVar30 = lVar30 + -1) {
              }
            }
            bVar32 = -(local_1d0 == (stack_array<idx2::v3<int>,_16> *)0x0) | (byte)lVar30;
            uVar22 = (uint)(char)((1L << (bVar21 & 0x3f) != uVar25) + bVar21);
            uVar23 = uVar22;
            if ((int)uVar38 < (int)uVar22) {
              uVar23 = uVar38;
            }
            uVar29 = (uint)(char)(((stack_array<idx2::v3<int>,_16> *)(1L << (bVar32 & 0x3f)) !=
                                  local_1d0) + bVar32);
            if ((int)uVar29 <= (int)uVar23) {
              uVar23 = uVar29;
            }
            uVar31 = 0;
            if (1 < (Idx2->BrickDims3).field_0.field_0.X) {
              uVar31 = uVar23;
            }
            pcVar35 = (str)0x0;
            if (1 < (Idx2->BrickDims3).field_0.field_0.Y) {
              pcVar35 = (str)(ulong)uVar23;
            }
            if ((Idx2->BrickDims3).field_0.field_0.Z < 2) {
              uVar23 = 0;
            }
            local_168 = CONCAT44(uVar22 - (int)pcVar35,uVar38 - uVar31);
            uStack_160 = CONCAT44(uStack_160._4_4_,uVar29 - uVar23);
            uVar36 = 0;
            do {
              if ((Idx2->BrickDims3).field_0.E[lVar24] == 1) {
                iVar15 = *(int *)((long)&local_168 + lVar24 * 4);
                if ((long)iVar15 < 1) {
                  iVar15 = iVar15 + -1;
                }
                else {
                  memset((void *)((long)&local_c8 + (long)(int)uVar36),(int)lVar24 + 0x58,
                         (long)iVar15);
                  uVar36 = (ulong)(uint)((int)uVar36 + iVar15);
                  iVar15 = -1;
                }
                *(int *)((long)&local_168 + lVar24 * 4) = iVar15;
              }
              lVar24 = lVar24 + 1;
            } while (lVar24 != 3);
            if (((0 < (int)local_168) || (0 < local_168._4_4_)) || (0 < (int)uStack_160)) {
              lVar30 = 0;
              do {
                do {
                  do {
                    do {
                      iVar15 = *(int *)((long)&local_168 + lVar30 * 4);
                      *(int *)((long)&local_168 + lVar30 * 4) = iVar15 + -1;
                      if (0 < iVar15) {
                        iVar15 = (int)uVar36;
                        uVar36 = (ulong)(iVar15 + 1);
                        *(byte *)((long)&local_c8 + (long)iVar15) = (byte)lVar30 | 0x58;
                      }
                      lVar30 = lVar30 + 1;
                    } while (lVar30 != 3);
                    lVar30 = 0;
                  } while (0 < (int)local_168);
                  lVar30 = 0;
                } while (0 < local_168._4_4_);
                lVar30 = 0;
              } while (0 < (int)uStack_160);
            }
            iVar15 = (int)uVar36;
            if (0 < iVar15) {
              iVar15 = iVar15 + 1;
              *(undefined1 *)((long)&local_c8 + uVar36) = 0x2b;
            }
            *(undefined8 *)((long)&local_c8 + (long)iVar15) = local_1f0;
            local_1b8.Ptr = (str)&local_c8;
            sVar17 = strlen(local_1b8.Ptr);
            uStack_1b0 = CONCAT44(uStack_1b0._4_4_,(int)sVar17);
            this = (idx2 *)EncodeTransformOrder((stref *)&local_1b8);
            (Idx2->BricksOrder).Arr[uVar42] = (unsigned_long)this;
            N3.field_0._8_4_ = SUB84((Idx2->BricksOrderStr).Buffer.Data + uVar42 * 0x81,0);
            N3.field_0.field_3.XY.field_0 = (v2<int>)(v2<int>)local_1d0;
            bVar32 = DecodeTransformOrder(this,(u64)P_00,N3,pcVar35);
            (Idx2->BricksOrderStr).Buffer.Data[uVar42 * 0x81 + 0x80] = bVar32;
            if (bVar32 < (Idx2->TransformOrderFull).Len) {
              local_1e0->Arr[0].field_0.field_3.XY.field_0 =
                   (anon_union_8_4_6ba14846_for_v2<int>_1)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
              ;
              *(undefined4 *)&(local_1e8->Buffer).Data = 0x205;
              break;
            }
            uVar42 = uVar42 + 1;
            bVar44 = uVar42 == (uint)(int)Idx2->NLevels;
          } while (!bVar44);
        }
        if (bVar44) {
          *(char **)(*in_FS_OFFSET + -0xe80) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
          ;
          *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x208;
        }
        else {
          *(undefined4 *)(*in_FS_OFFSET + -0xf7c) = 0x2ea;
          *(char **)(*in_FS_OFFSET + -0xe78) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
          ;
          pcVar19 = "";
          unaff_R13 = 0x117;
        }
        auVar7._8_8_ = unaff_R13;
        auVar7._0_8_ = pcVar19;
        auVar8 = auVar7._0_12_;
        if (bVar44) {
          iVar15 = Idx2->BricksPerChunkIn;
          iVar33 = Idx2->ChunksPerFileIn;
          (Idx2->BricksPerChunk).Arr[0] = iVar15;
          (Idx2->ChunksPerFile).Arr[0] = iVar33;
          if (iVar15 < 0x8001) {
            if (POPCOUNT(iVar15) == 1) {
              if (iVar33 < 0x132b) {
                if (POPCOUNT(iVar33) == 1) {
                  if (Idx2->NLevels != '\0') {
                    local_1d0 = &Idx2->BricksPerChunk3s;
                    local_1d8 = &Idx2->NBricks3;
                    local_1e0 = &Idx2->ChunksPerFile3s;
                    local_1e8 = &Idx2->ChunksOrderStr;
                    local_40 = &Idx2->FilesOrderStr;
                    uVar42 = 0;
                    do {
                      uStack_a8 = 0;
                      plStack_a0 = (long *)0x0;
                      uStack_98 = 0;
                      uStack_90 = 0;
                      local_c8.Ptr = (str)0x0;
                      uStack_c0 = 0;
                      puStack_b8 = (undefined8 *)0x0;
                      lStack_b0 = 0;
                      local_88 = 0;
                      local_178 = 0;
                      uStack_198 = 0;
                      plStack_190 = (long *)0x0;
                      uStack_188 = 0;
                      uStack_180 = 0;
                      local_1b8.Ptr = (str)0x0;
                      uStack_1b0 = 0;
                      puStack_1a8 = (undefined8 *)0x0;
                      lStack_1a0 = 0;
                      local_128 = 0;
                      local_148 = 0;
                      uStack_140 = 0;
                      uStack_138 = 0;
                      uStack_130 = 0;
                      local_168 = 0;
                      uStack_160 = 0;
                      uStack_158 = 0;
                      uStack_150 = 0;
                      if (uVar42 == 0x10) {
                        pcVar19 = 
                        "t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]";
                        goto LAB_001687f4;
                      }
                      lVar24 = uVar42 * 0x81;
                      pbVar1 = (local_38->Buffer).Data;
                      uVar36 = (ulong)(Idx2->BricksPerChunk).Arr[0];
                      lVar30 = 0x3f;
                      if (uVar36 != 0) {
                        for (; uVar36 >> lVar30 == 0; lVar30 = lVar30 + -1) {
                        }
                      }
                      bVar32 = -(uVar36 == 0) | (byte)lVar30;
                      bVar32 = (1L << (bVar32 & 0x3f) != uVar36) + bVar32;
                      if (pbVar1[lVar24 + 0x80] < bVar32) {
                        bVar32 = pbVar1[lVar24 + 0x80];
                      }
                      iVar15 = 1 << (bVar32 & 0x1f);
                      uVar36 = (ulong)iVar15;
                      lVar30 = 0x3f;
                      if (uVar36 != 0) {
                        for (; uVar36 >> lVar30 == 0; lVar30 = lVar30 + -1) {
                        }
                      }
                      (Idx2->BricksPerChunk).Arr[uVar42] = iVar15;
                      local_88 = (1L << ((byte)lVar30 & 0x3f) != uVar36) + (byte)lVar30;
                      pvVar2 = local_1d0->Arr + uVar42;
                      (pvVar2->field_0).field_3.XY.field_0 =
                           (anon_union_8_4_6ba14846_for_v2<int>_1)0x100000001;
                      (pvVar2->field_0).field_0.Z = 1;
                      uVar38 = (uint)local_88;
                      if (local_88 != 0) {
                        uVar23 = 0;
                        iVar15 = -1;
                        do {
                          if (0x7f < (int)((uint)pbVar1[lVar24 + 0x80] + iVar15)) goto LAB_00168784;
                          bVar13 = pbVar1[(int)((uint)pbVar1[lVar24 + 0x80] + iVar15) + lVar24];
                          if (0x5a < (long)(char)bVar13) goto LAB_001687bd;
                          piVar34 = (int *)((long)pvVar2 + ((long)(char)bVar13 + -0x58) * 4);
                          *piVar34 = *piVar34 << 1;
                          if (0x3f < (int)(uVar38 + iVar15)) goto LAB_0016876d;
                          *(byte *)((long)&local_c8 + (long)(int)(uVar38 + iVar15)) = bVar13;
                          uVar23 = uVar23 + 1;
                          uVar38 = (uint)local_88;
                          iVar15 = iVar15 + -1;
                        } while (uVar23 != uVar38);
                      }
                      local_118.Ptr = (str)&local_c8;
                      uStack_110 = CONCAT44(uStack_110._4_4_,uVar38);
                      uVar18 = EncodeTransformOrder((stref *)&local_118);
                      (Idx2->BricksOrderInChunk).Arr[uVar42] = uVar18;
                      iVar15 = (pvVar2->field_0).field_0.X;
                      iVar33 = (pvVar2->field_0).field_0.Y;
                      iVar27 = local_1d8->Arr[uVar42].field_0.field_0.Z;
                      iVar14 = (pvVar2->field_0).field_0.Z;
                      (Idx2->NChunks3).Arr[uVar42].field_0.field_3.XY.field_0 =
                           (anon_union_8_4_6ba14846_for_v2<int>_1)
                           ((long)(local_1d8->Arr[uVar42].field_0.field_0.Y + iVar33 + -1) /
                            (long)iVar33 << 0x20 |
                           (long)(local_1d8->Arr[uVar42].field_0.field_0.X + -1 + iVar15) /
                           (long)iVar15 & 0xffffffffU);
                      (Idx2->NChunks3).Arr[uVar42].field_0.field_0.Z =
                           (iVar27 + iVar14 + -1) / iVar14;
                      uVar36 = (ulong)(Idx2->ChunksPerFile).Arr[0];
                      lVar30 = 0x3f;
                      if (uVar36 != 0) {
                        for (; uVar36 >> lVar30 == 0; lVar30 = lVar30 + -1) {
                        }
                      }
                      bVar32 = -(uVar36 == 0) | (byte)lVar30;
                      bVar32 = (1L << (bVar32 & 0x3f) != uVar36) + bVar32;
                      pbVar1 = (Idx2->BricksOrderStr).Buffer.Data;
                      if ((byte)(pbVar1[lVar24 + 0x80] - local_88) < bVar32) {
                        bVar32 = pbVar1[lVar24 + 0x80] - local_88;
                      }
                      iVar15 = 1 << (bVar32 & 0x1f);
                      uVar36 = (ulong)iVar15;
                      lVar30 = 0x3f;
                      if (uVar36 != 0) {
                        for (; uVar36 >> lVar30 == 0; lVar30 = lVar30 + -1) {
                        }
                      }
                      (Idx2->ChunksPerFile).Arr[uVar42] = iVar15;
                      local_178 = (1L << ((byte)lVar30 & 0x3f) != uVar36) + (byte)lVar30;
                      pvVar2 = local_1e0->Arr + uVar42;
                      local_1e0->Arr[uVar42].field_0.field_3.XY.field_0 =
                           (anon_union_8_4_6ba14846_for_v2<int>_1)0x100000001;
                      local_1e0->Arr[uVar42].field_0.field_0.Z = 1;
                      uVar38 = (uint)local_178;
                      if (local_178 != 0) {
                        uVar23 = (uint)local_88;
                        uVar22 = 0;
                        iVar15 = -1;
                        do {
                          iVar33 = (pbVar1[lVar24 + 0x80] - uVar23) + iVar15;
                          if (0x7f < iVar33) goto LAB_00168784;
                          bVar13 = pbVar1[iVar33 + lVar24];
                          if (0x5a < (long)(char)bVar13) {
LAB_001687bd:
                            __assert_fail("Idx < 3",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                                          ,0x29c,"t &idx2::v3<int>::operator[](int) const [t = int]"
                                         );
                          }
                          piVar34 = (int *)((long)pvVar2 + ((long)(char)bVar13 + -0x58) * 4);
                          *piVar34 = *piVar34 << 1;
                          if (0x3f < (int)(uVar38 + iVar15)) goto LAB_0016876d;
                          *(byte *)((long)&local_1b8 + (long)(int)(uVar38 + iVar15)) = bVar13;
                          uVar22 = uVar22 + 1;
                          uVar38 = (uint)local_178;
                          iVar15 = iVar15 + -1;
                        } while (uVar22 != uVar38);
                      }
                      pvVar43 = (Idx2->NChunks3).Arr + uVar42;
                      local_118.Ptr = (str)&local_1b8;
                      uStack_110 = CONCAT44(uStack_110._4_4_,uVar38);
                      uVar18 = EncodeTransformOrder((stref *)&local_118);
                      (Idx2->ChunksOrderInFile).Arr[uVar42] = uVar18;
                      iVar15 = (pvVar2->field_0).field_0.X;
                      uVar38 = (pvVar2->field_0).field_0.Y;
                      pcVar35 = (str)(ulong)uVar38;
                      iVar33 = (pvVar43->field_0).field_0.Z;
                      iVar27 = (pvVar2->field_0).field_0.Z;
                      (Idx2->NFiles3).Arr[uVar42].field_0.field_3.XY.field_0 =
                           (anon_union_8_4_6ba14846_for_v2<int>_1)
                           ((long)(int)((pvVar43->field_0).field_0.Y + uVar38 + -1) /
                            (long)(int)uVar38 << 0x20 |
                           (long)((pvVar43->field_0).field_0.X + -1 + iVar15) / (long)iVar15 &
                           0xffffffffU);
                      (Idx2->NFiles3).Arr[uVar42].field_0.field_0.Z =
                           (iVar33 + iVar27 + -1) / iVar27;
                      local_f8 = 0;
                      uStack_f0 = 0;
                      uStack_e8 = 0;
                      uStack_e0 = 0;
                      local_118.Ptr = (str)0x0;
                      uStack_110 = 0;
                      uStack_108 = 0;
                      uStack_100 = 0;
                      pbVar1 = (Idx2->BricksOrderStr).Buffer.Data;
                      uVar38 = (uint)local_88;
                      uVar36 = (ulong)(1 << (pbVar1[lVar24 + 0x80] - local_88 & 0x1f));
                      lVar30 = 0x3f;
                      if (uVar36 != 0) {
                        for (; uVar36 >> lVar30 == 0; lVar30 = lVar30 + -1) {
                        }
                      }
                      local_d8 = (1L << ((byte)lVar30 & 0x3f) != uVar36) + (byte)lVar30;
                      uVar23 = (uint)local_d8;
                      if (local_d8 != 0) {
                        uVar22 = 0;
                        iVar15 = -1;
                        do {
                          iVar33 = (pbVar1[lVar24 + 0x80] - uVar38) + iVar15;
                          if (0x7f < iVar33) goto LAB_00168784;
                          if (0x3f < (int)(uVar23 + iVar15)) goto LAB_0016876d;
                          pcVar35 = (str)CONCAT71((int7)(int3)((uint)iVar33 >> 8),
                                                  pbVar1[iVar33 + lVar24]);
                          *(byte *)((long)&local_118 + (long)(int)(uVar23 + iVar15)) =
                               pbVar1[iVar33 + lVar24];
                          uVar22 = uVar22 + 1;
                          uVar23 = (uint)local_d8;
                          iVar15 = iVar15 + -1;
                        } while (uVar22 != uVar23);
                      }
                      local_1c8.Ptr = (str)&local_118;
                      local_1c0 = uVar23;
                      uVar18 = EncodeTransformOrder((stref *)&local_1c8);
                      (Idx2->ChunksOrder).Arr[uVar42] = uVar18;
                      Resize<idx2::stack_string<128>>(local_1e8,(long)Idx2->NLevels);
                      N3_00.field_0.field_0.Y = 0;
                      N3_00.field_0.field_0.X = (pvVar43->field_0).field_0.Z;
                      N3_00.field_0._8_4_ = SUB84((Idx2->ChunksOrderStr).Buffer.Data + lVar24,0);
                      bVar13 = DecodeTransformOrder
                                         ((idx2 *)(Idx2->ChunksOrder).Arr[uVar42],
                                          (u64)(pvVar43->field_0).field_3.XY.field_0,N3_00,pcVar35);
                      (Idx2->ChunksOrderStr).Buffer.Data[lVar24 + 0x80] = bVar13;
                      pbVar1 = (Idx2->BricksOrderStr).Buffer.Data;
                      uVar38 = (uint)local_88;
                      uVar36 = (ulong)(1 << (pbVar1[lVar24 + 0x80] - (char)(local_178 + uVar38) &
                                            0x1f));
                      lVar30 = 0x3f;
                      if (uVar36 != 0) {
                        for (; uVar36 >> lVar30 == 0; lVar30 = lVar30 + -1) {
                        }
                      }
                      local_128 = (1L << ((byte)lVar30 & 0x3f) != uVar36) + (byte)lVar30;
                      uVar23 = (uint)local_128;
                      if (local_128 != 0) {
                        uVar22 = 0;
                        iVar15 = -1;
                        do {
                          iVar33 = ((uint)pbVar1[lVar24 + 0x80] - (local_178 + uVar38)) + iVar15;
                          if (0x7f < iVar33) goto LAB_00168784;
                          if (0x3f < (int)(uVar23 + iVar15)) goto LAB_0016876d;
                          pcVar35 = (str)CONCAT71((int7)(int3)((uint)iVar33 >> 8),
                                                  pbVar1[iVar33 + lVar24]);
                          *(byte *)((long)&local_168 + (long)(int)(uVar23 + iVar15)) =
                               pbVar1[iVar33 + lVar24];
                          uVar22 = uVar22 + 1;
                          uVar23 = (uint)local_128;
                          iVar15 = iVar15 + -1;
                        } while (uVar22 != uVar23);
                      }
                      pvVar2 = (Idx2->NFiles3).Arr + uVar42;
                      local_118.Ptr = (str)&local_168;
                      uStack_110 = CONCAT44(uStack_110._4_4_,uVar23);
                      uVar18 = EncodeTransformOrder((stref *)&local_118);
                      (Idx2->FilesOrder).Arr[uVar42] = uVar18;
                      Resize<idx2::stack_string<128>>(local_40,(long)Idx2->NLevels);
                      P_00 = *(params **)&pvVar2->field_0;
                      N3_01.field_0.field_0.Y = 0;
                      N3_01.field_0.field_0.X = (pvVar2->field_0).field_0.Z;
                      N3_01.field_0._8_4_ = SUB84((Idx2->FilesOrderStr).Buffer.Data + lVar24,0);
                      bVar13 = DecodeTransformOrder
                                         ((idx2 *)(Idx2->FilesOrder).Arr[uVar42],(u64)P_00,N3_01,
                                          pcVar35);
                      (Idx2->FilesOrderStr).Buffer.Data[lVar24 + 0x80] = bVar13;
                      uVar42 = uVar42 + 1;
                    } while (uVar42 != (uint)(int)Idx2->NLevels);
                  }
                  uVar39 = 0;
                  uVar41 = 0x26e;
                }
                else {
                  uVar39 = 0x21;
                  uVar41 = 0x219;
                }
              }
              else {
                uVar39 = 0x20;
                uVar41 = 0x217;
              }
            }
            else {
              uVar39 = 0x22;
              uVar41 = 0x215;
            }
          }
          else {
            uVar39 = 0x1f;
            uVar41 = 0x213;
          }
          *(char **)(*in_FS_OFFSET + -0xe80) =
               "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
          ;
          *(undefined4 *)(*in_FS_OFFSET + -0xf80) = uVar41;
          local_c8.Ptr = "";
          uStack_c0._0_3_ = uVar39;
          if ((char)uVar39 == '\0') {
            eVar48 = ComputeFileDirDepths(Idx2,P_00);
            local_c8 = (anon_union_8_2_2df48d06_for_stref_0)eVar48.Msg;
            uStack_c0._0_3_ = eVar48._8_3_;
            if (eVar48.Code == NoError) {
              ComputeWaveletTransformDetails(Idx2);
              *(char **)(*in_FS_OFFSET + -0xe80) =
                   "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
              ;
              *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x2f1;
              auVar8 = SUB1612(ZEXT816(0x1a94c3),0);
            }
            else {
              local_1b8.Ptr = (str)&local_c8;
              eVar48 = Finalize::anon_class_8_1_32d6a57b::operator()
                                 ((anon_class_8_1_32d6a57b *)&local_1b8);
              auVar8 = eVar48._0_12_;
            }
          }
          else {
            local_1b8.Ptr = (str)&local_c8;
            eVar48 = Finalize::anon_class_8_1_32d6a57b::operator()
                               ((anon_class_8_1_32d6a57b *)&local_1b8);
            auVar8 = eVar48._0_12_;
          }
        }
      }
    }
    else {
      *(char **)(*in_FS_OFFSET + -0xe80) =
           "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
      ;
      *(undefined4 *)(*in_FS_OFFSET + -0xf80) = 0x2dd;
      pnVar16 = &idx2_err_code_s::NameMap;
      iVar20 = idx2_err_code_s::NameMap.Arr[0].ItemVal;
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != TooManyLevels) {
        lVar30 = 0x28;
        do {
          if (lVar30 == 0x3b8) {
            iVar20 = __Invalid__;
            goto LAB_0016727b;
          }
          pcVar19 = (char *)((long)&idx2_err_code_s::NameMap.Arr[0].Name.field_0 + lVar30);
          lVar30 = lVar30 + 0x18;
        } while (*pcVar19 != '\x17');
        iVar20 = TooManyLevels;
      }
LAB_0016727b:
      if (idx2_err_code_s::NameMap.Arr[0].ItemVal != iVar20) {
        lVar30 = 0;
        do {
          lVar24 = lVar30;
          if (lVar24 == 0x390) goto LAB_0016874e;
          lVar30 = lVar24 + 0x18;
        } while ((&idx2_err_code_s::NameMap.Arr[1].ItemVal)[lVar24] != iVar20);
        pnVar16 = (name_map *)((long)&idx2_err_code_s::NameMap.Arr[1].Name.field_0 + lVar24);
      }
      lVar30 = *in_FS_OFFSET;
      iVar15 = snprintf((char *)(lVar30 + -0xc80),0x400,"%.*s (file %s, line %d): ",
                        (ulong)(uint)pnVar16->Arr[0].Name.Size,pnVar16->Arr[0].Name.field_0.Ptr,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/idx2Common.cpp"
                        ,0x2dd);
      snprintf((char *)(lVar30 + -0xc80) + iVar15,0x400 - (long)iVar15,"Max # of levels = %d\n",0x10
              );
      auVar10._8_8_ = 0x10017;
      auVar10._0_8_ = "Max # of levels = %d\n";
      auVar8 = auVar10._0_12_;
    }
  }
  uVar38 = auVar8._8_4_ & 0xffffff;
  eVar48.Code = (char)uVar38;
  eVar48.StackIdx = (char)(uVar38 >> 8);
  eVar48.StrGened = (bool)(char)(uVar38 >> 0x10);
  eVar48._11_1_ = (char)(uVar38 >> 0x18);
  eVar48.Msg = (cstr)auVar8._0_8_;
  eVar48._12_4_ = 0;
  return eVar48;
LAB_00168784:
  pcVar19 = "char &idx2::stack_string<128>::operator[](int) const [N = 128]";
  goto LAB_00168799;
LAB_001687a6:
  pcVar19 = 
  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]";
LAB_001687f4:
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x20c,pcVar19);
LAB_0016876d:
  pcVar19 = "char &idx2::stack_string<64>::operator[](int) const [N = 64]";
LAB_00168799:
  __assert_fail("Idx < N",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                ,0x237,pcVar19);
}

Assistant:

error<idx2_err_code>
Finalize(idx2_file* Idx2, params* P)
{
  idx2_PropagateIfError(CheckBrickSize(Idx2, *P));
  P->Tolerance = Max(fabs(P->Tolerance), Idx2->Tolerance);
  //printf("tolerance = %.16f\n", P->Tolerance);
  GuessNumLevelsIfNeeded(Idx2);
  if (!(Idx2->NLevels <= idx2_file::MaxLevels))
    return idx2_Error(idx2_err_code::TooManyLevels, "Max # of levels = %d\n", Idx2->MaxLevels);
  if ((Idx2->BitPlanesPerChunk > Idx2->BitPlanesPerFile) ||
      (Idx2->BitPlanesPerFile % Idx2->BitPlanesPerChunk) != 0)
    return idx2_Error(idx2_err_code::SizeMismatched, "BitPlanesPerFile not multiple of BitPlanesPerChunk\n");


  char TformOrder[8] = {};
  ComputeTransformOrder(Idx2, *P, TformOrder);

  BuildSubbands(Idx2, *P);

  ComputeNumBricksPerLevel(Idx2, *P);

  idx2_PropagateIfError(ComputeGlobalBricksOrder(Idx2, *P, TformOrder));
  idx2_PropagateIfError(ComputeLocalBricksChunksFilesOrders(Idx2, *P));

  idx2_PropagateIfError(ComputeFileDirDepths(Idx2, *P));

  ComputeWaveletTransformDetails(Idx2);

  return idx2_Error(idx2_err_code::NoError);
}